

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::InvalidateAllPropertyGuards(ThreadContext *this)

{
  Type *this_00;
  int iVar1;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *pWVar2;
  PropertyRecord *propertyRecord;
  int iVar3;
  RecyclableData *pRVar4;
  long lVar5;
  int i;
  
  pRVar4 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  if (0 < (pRVar4->propertyGuards).count - (pRVar4->propertyGuards).freeCount) {
    this_00 = &pRVar4->propertyGuards;
    iVar3 = this_00->size;
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        i = (pRVar4->propertyGuards).buckets.ptr[lVar5];
        if (i != -1) {
          iVar3 = -1;
          do {
            pWVar2 = (pRVar4->propertyGuards).entries.ptr;
            propertyRecord =
                 (PropertyRecord *)((pWVar2[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
            if (propertyRecord == (PropertyRecord *)0x0) {
              iVar1 = pWVar2[i].next;
              JsUtil::
              WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
              ::RemoveEntry(this_00,i,iVar3,(uint)lVar5);
            }
            else {
              InvalidatePropertyGuardEntry(this,propertyRecord,pWVar2[i].value.ptr,true);
              iVar1 = pWVar2[i].next;
              iVar3 = i;
            }
            i = iVar1;
          } while (i != -1);
          iVar3 = this_00->size;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar3);
    }
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
    ::Clear(this_00);
    return;
  }
  return;
}

Assistant:

void
ThreadContext::InvalidateAllPropertyGuards()
{
    PropertyGuardDictionary &guards = this->recyclableData->propertyGuards;
    if (guards.Count() > 0)
    {
        guards.Map([this](Js::PropertyRecord const * propertyRecord, PropertyGuardEntry* entry, const RecyclerWeakReference<const Js::PropertyRecord>* weakRef)
        {
            InvalidatePropertyGuardEntry(propertyRecord, entry, true);
        });

        guards.Clear();
    }
}